

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_Txid256bit_Test::TestBody(Txid_Txid256bit_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_108;
  Message local_100;
  int local_f4;
  ByteData local_f0;
  unsigned_long local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  string local_b0 [32];
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Txid txid;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ByteData256 byte_data;
  Txid_Txid256bit_Test *this_local;
  
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"3412907856341290785634129078563412907856341290785634129078563412",&local_49);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::Txid::Txid((Txid *)&gtest_ar.message_,(ByteData256 *)local_28);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"txid.GetHex().c_str()",
             "\"1234567890123456789012345678901234567890123456789012345678901234\"",pcVar2,
             "1234567890123456789012345678901234567890123456789012345678901234");
  std::__cxx11::string::~string(local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txid.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  cfd::core::Txid::GetData();
  local_d8 = cfd::core::ByteData::GetDataSize();
  local_f4 = 0x20;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_d0,"txid.GetData().GetDataSize()","32",&local_d8,&local_f4);
  cfd::core::ByteData::~ByteData(&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txid.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_28);
  return;
}

Assistant:

TEST(Txid, Txid256bit) {
  ByteData256 byte_data = ByteData256(
      "3412907856341290785634129078563412907856341290785634129078563412");
  Txid txid = Txid(byte_data);
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_EQ(txid.GetData().GetDataSize(), 32);
}